

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O2

int __thiscall
Fl_PostScript_Graphics_Driver::alpha_mask
          (Fl_PostScript_Graphics_Driver *this,uchar *data,int w,int h,int D,int LD)

{
  short *psVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  uchar *puVar9;
  ulong uVar10;
  void *pvVar11;
  void *pvVar12;
  long lVar13;
  short sVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  bool bVar30;
  
  this->mask = (uchar *)0x0;
  if ((D / 2) * 2 == D) {
    iVar8 = D * w + LD;
    bVar4 = false;
    uVar20 = 0;
    if (0 < w) {
      uVar20 = (ulong)(uint)w;
    }
    iVar18 = 0;
    if (0 < h) {
      iVar18 = h;
    }
    bVar3 = false;
    iVar23 = 0;
    iVar22 = D;
    do {
      if (iVar23 == iVar18) {
        if (!bVar3) {
          return 0;
        }
        if (bVar4) {
          iVar22 = (w + 7) / 8;
          uVar15 = iVar22 * h;
          puVar9 = (uchar *)operator_new__((long)(int)uVar15);
          this->mask = puVar9;
          uVar10 = 0;
          uVar24 = (ulong)uVar15;
          if ((int)uVar15 < 1) {
            uVar24 = uVar10;
          }
          for (; uVar24 != uVar10; uVar10 = uVar10 + 1) {
            this->mask[uVar10] = '\0';
          }
          iVar23 = D;
          for (iVar25 = 0; iVar25 != iVar18; iVar25 = iVar25 + 1) {
            iVar28 = iVar23;
            for (uVar24 = 0; uVar20 != uVar24; uVar24 = uVar24 + 1) {
              if (data[(long)iVar28 + -1] != '\0') {
                this->mask[(int)(((uint)(uVar24 >> 3) & 0x1fffffff) + iVar25 * iVar22)] =
                     this->mask[(int)(((uint)(uVar24 >> 3) & 0x1fffffff) + iVar25 * iVar22)] |
                     (byte)(1 << ((byte)uVar24 & 7));
              }
              iVar28 = iVar28 + D;
            }
            iVar23 = iVar23 + iVar8;
          }
          this->mx = w;
          this->my = h;
          return 0;
        }
        return 1;
      }
      bVar2 = false;
      uVar24 = uVar20;
      iVar25 = iVar22;
      while (bVar30 = uVar24 != 0, uVar24 = uVar24 - 1, bVar30) {
        if (data[(long)iVar25 + -1] == 0xff) {
          bVar4 = true;
        }
        else if (data[(long)iVar25 + -1] == '\0') {
          bVar3 = true;
        }
        else {
          bVar2 = true;
        }
        iVar25 = iVar25 + D;
      }
      iVar23 = iVar23 + 1;
      iVar22 = iVar22 + iVar8;
    } while (!bVar2);
    iVar22 = (w + 1) / 2;
    uVar15 = h * 4 * iVar22;
    puVar9 = (uchar *)operator_new__((long)(int)uVar15);
    this->mask = puVar9;
    uVar10 = 0;
    uVar24 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar24 = uVar10;
    }
    for (; uVar24 != uVar10; uVar10 = uVar10 + 1) {
      this->mask[uVar10] = '\0';
    }
    this->mx = w * 4;
    this->my = h * 4;
    uVar15 = w * 4 + 2;
    uVar24 = 0xffffffffffffffff;
    if (-1 < w) {
      uVar24 = (long)(int)uVar15 * 2;
    }
    pvVar11 = operator_new__(uVar24);
    pvVar12 = operator_new__(uVar24);
    uVar10 = 0;
    uVar24 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar24 = uVar10;
    }
    for (; uVar24 != uVar10; uVar10 = uVar10 + 1) {
      *(undefined2 *)((long)pvVar12 + uVar10 * 2) = 0;
    }
    for (uVar10 = 0; uVar24 != uVar10; uVar10 = uVar10 + 1) {
      *(undefined2 *)((long)pvVar11 + uVar10 * 2) = 0;
    }
    lVar17 = (long)w;
    for (iVar23 = 0; iVar23 != iVar18; iVar23 = iVar23 + 1) {
      iVar25 = iVar23 * iVar8 + D;
      for (uVar15 = 0; uVar15 < 4; uVar15 = uVar15 + 2) {
        uVar16 = uVar15 | iVar23 * 4;
        *(undefined2 *)((long)pvVar11 + 2) = 0;
        uVar10 = 0;
        for (uVar24 = 0; uVar24 != uVar20; uVar24 = uVar24 + 1) {
          lVar13 = (uVar10 & 0xffffffff) * 2;
          for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
            sVar5 = (ushort)data[(long)((int)uVar24 * D + iVar25) + -1] +
                    *(short *)((long)pvVar12 + lVar27 * 2 + lVar13 + 2);
            if (0x7f < sVar5) {
              this->mask[(int)(((uint)(uVar24 >> 1) & 0x1fffffff) + uVar16 * iVar22)] =
                   this->mask[(int)(((uint)(uVar24 >> 1) & 0x1fffffff) + uVar16 * iVar22)] |
                   '\x01' << ((char)lVar27 + (char)uVar10 & 7U);
              sVar5 = sVar5 + -0xff;
            }
            iVar28 = (int)sVar5;
            sVar6 = *(short *)((long)pvVar11 + lVar27 * 2 + lVar13);
            if (sVar5 < 1) {
              sVar7 = (short)((iVar28 * 3 + -8) / 0x10);
              *(short *)((long)pvVar11 + lVar27 * 2 + lVar13) = sVar6 + sVar7;
              sVar14 = (short)((iVar28 * 7 + -8) / 0x10);
              psVar1 = (short *)((long)pvVar12 + lVar27 * 2 + lVar13 + 4);
              *psVar1 = *psVar1 + sVar14;
              sVar6 = (short)((iVar28 + -8) / 0x10);
            }
            else {
              sVar7 = (short)(iVar28 * 3 + 8U >> 4);
              psVar1 = (short *)((long)pvVar12 + lVar27 * 2 + lVar13 + 4);
              sVar14 = (short)(iVar28 * 7 + 8U >> 4);
              *psVar1 = *psVar1 + sVar14;
              *(short *)((long)pvVar11 + lVar27 * 2 + lVar13) = sVar6 + sVar7;
              sVar6 = (short)((iVar28 + 8U & 0xffff) >> 4);
            }
            *(short *)((long)pvVar11 + lVar27 * 2 + lVar13 + 4) = sVar6;
            psVar1 = (short *)((long)pvVar11 + lVar27 * 2 + lVar13 + 2);
            *psVar1 = *psVar1 + (sVar5 - (sVar6 + sVar7 + sVar14));
          }
          uVar10 = uVar10 + 4;
        }
        *(undefined2 *)((long)pvVar12 + 2) = 0;
        lVar13 = lVar17;
        lVar27 = (long)pvVar11 + lVar17 * 8 + -2;
        lVar29 = (long)pvVar12 + lVar17 * 8 + 2;
        iVar28 = w * 4 + -1;
        while (0 < lVar13) {
          lVar13 = lVar13 + -1;
          for (lVar21 = 0; -1 < lVar21 + 3; lVar21 = lVar21 + -1) {
            sVar5 = (ushort)data[(long)((int)lVar13 * D + iVar25) + -1] +
                    *(short *)(lVar27 + 2 + lVar21 * 2);
            if (0x7f < sVar5) {
              uVar19 = (int)lVar21 + iVar28;
              this->mask[(int)((uVar19 >> 3) + (uVar16 | 1) * iVar22)] =
                   this->mask[(int)((uVar19 >> 3) + (uVar16 | 1) * iVar22)] |
                   (byte)(1 << ((byte)uVar19 & 7));
              sVar5 = sVar5 + -0xff;
            }
            iVar26 = (int)sVar5;
            sVar6 = *(short *)(lVar29 + lVar21 * 2);
            if (sVar5 < 1) {
              sVar7 = (short)((long)(iVar26 * 3 + -8) / 0x10);
              *(short *)(lVar29 + lVar21 * 2) = sVar6 + sVar7;
              sVar14 = (short)((long)(iVar26 * 7 + -8) / 0x10);
              psVar1 = (short *)(lVar27 + lVar21 * 2);
              *psVar1 = *psVar1 + sVar14;
              sVar6 = (short)((iVar26 + -8) / 0x10);
            }
            else {
              sVar7 = (short)(iVar26 * 3 + 8U >> 4);
              psVar1 = (short *)(lVar27 + lVar21 * 2);
              sVar14 = (short)(iVar26 * 7 + 8U >> 4);
              *psVar1 = *psVar1 + sVar14;
              *(short *)(lVar29 + lVar21 * 2) = sVar6 + sVar7;
              sVar6 = (short)((iVar26 + 8U & 0xffff) >> 4);
            }
            *(short *)(lVar29 + -4 + lVar21 * 2) = sVar6;
            psVar1 = (short *)(lVar29 + -2 + lVar21 * 2);
            *psVar1 = *psVar1 + (sVar5 - (sVar6 + sVar7 + sVar14));
          }
          lVar29 = lVar29 + -8;
          iVar28 = iVar28 + -4;
          lVar27 = lVar27 + -8;
        }
      }
    }
    operator_delete__(pvVar11);
    operator_delete__(pvVar12);
  }
  return 0;
}

Assistant:

int Fl_PostScript_Graphics_Driver::alpha_mask(const uchar * data, int w, int h, int D, int LD){

  mask = 0;
  if ((D/2)*2 != D){ //no mask info
    return 0;
  }
  int xx;
  int i,j, k, l;
  LD += w*D;
  int V255=0;
  int V0 =0;
  int V_=0;
  for (j=0;j<h;j++){
    for (i=0;i<w;i++)
      switch(data[j*LD+D*i+D-1]){
        case 255: V255 = 1; break;
        case 0: V0 = 1; break;
        default: V_= 1;
      }
    if (V_) break;
  };
  if (!V_){
    if (V0)
      if (V255){// not true alpha, only masking
        xx = (w+7)/8;
        mask = new uchar[h * xx];
        for (i=0;i<h * xx;i++) mask[i]=0;
        for (j=0;j<h;j++)
          for (i=0;i<w;i++)
            if (data[j*LD+D*i+D-1])
              mask[j*xx+i/8] |= 1 << (i % 8);
        mx = w;
        my = h; //mask imensions
        return 0;
      } else {
        mask=0;
        return 1; //everything masked
      }
    else
      return 0;
  }



  /////   Alpha dither, generating (4*w) * 4 mask area       /////
  /////         with Floyd-Steinberg error diffusion         /////

  mask = new uchar[((w+1)/2) * h * 4];

  for (i = 0; i<((w+1)/2) * h * 4; i++) mask[i] = 0; //cleaning



  mx= w*4;
  my=h*4; // mask dimensions

  xx = (w+1)/2;                //  mask line width in bytes

  short * errors1 = new short [w*4+2]; //  two rows of dither errors
  short * errors2 = new short [w*4+2]; //  two rows of dither errors

  for (i=0; i<w*4+2; i++) errors2[i] = 0; // cleaning,after first swap will become current
  for (i=0; i<w*4+2; i++) errors1[i] = 0; // cleaning,after first swap will become current

  short * current = errors1;
  short * next = errors2;
  short * swap;

  for (j=0; j<h; j++){
    for (l=0; l<4; ){           // generating 4 rows of mask lines for 1 RGB line
      int jj = j*4+l;

      /// mask row index
      swap = next;
      next = current;
      current = swap;
      *(next+1) = 0;          // must clean the first cell, next are overriden by *1
      for (i=0; i<w; i++){
        for (k=0; k<4; k++){   // generating 4 x-pixels for 1 RGB
          short error, o1, o2, o3;
          int ii = i*4+k;   // mask cell index
          short val = data[j*LD+D*i+D-1] + current[1+ii];
          if (val>127){
            mask[jj*xx+ii/8]  |= 1 << (ii % 8); //set mask bit
            error =  val-255;
          }else
            error = val;

          ////// error spreading /////
          if (error >0){
            next[ii] +=  o1 = (error * 3 + 8)/16;
            current[ii+2] += o2 = (error * 7 + 8)/16;
            next[ii+2] = o3 =(error + 8)/16;  // *1 - ok replacing (cleaning)
          } else {
            next[ii] += o1 = (error * 3 - 8)/16;
            current[ii+2] += o2 = (error * 7 - 8)/16;
            next[ii+2] = o3 = (error - 8)/16;
          }
          next[1+ii] += error - o1 - o2 - o3;
        }
      }
      l++;

      ////// backward

      jj = j*4+l;
      swap = next;
      next = current;
      current = swap;
      *(next+1) = 0;          // must clean the first cell, next are overriden by *1

      for (i = w-1; i >= 0; i--){

        for (k=3; k>=0; k--){   // generating 4 x-pixels for 1 RGB
          short error, o1, o2, o3;

          int ii = i*4+k;   // mask cell index
          short val = data[j*LD+D*i+D-1] + current[1+ii];
          if (val>127){

            mask[jj*xx+ii/8]  |= 1 << (ii % 8); //set mask bit
            error =  val-255;
          } else
            error = val;

          ////// error spreading /////
          if (error >0){
            next[ii+2] +=  o1 = (error * 3 + 8)/16;
            current[ii] += o2 = (error * 7 + 8)/16;
            next[ii] = o3 =(error + 8)/16;  // *1 - ok replacing (cleaning)
          } else {
            next[ii+2] += o1 = (error * 3 - 8)/16;

            current[ii] += o2 = (error * 7 - 8)/16;
            next[ii] = o3 = (error - 8)/16;
          }
          next[1+ii] += error - o1 - o2 - o3;
        }
      }
      l++;
    }
  }
  delete[] errors1;
  delete[] errors2;
  return 0;
}